

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsView::contextMenuEvent(QGraphicsView *this,QContextMenuEvent *event)

{
  long lVar1;
  undefined8 uVar2;
  QWidget *widget;
  QObject *pQVar3;
  long in_FS_OFFSET;
  QPointF QVar4;
  undefined1 local_58 [12];
  QContextMenuEvent QStack_4c;
  undefined3 uStack_4b;
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if ((((*(long *)(lVar1 + 0x490) != 0) && (*(int *)(*(long *)(lVar1 + 0x490) + 4) != 0)) &&
      (*(long *)(lVar1 + 0x498) != 0)) && ((*(byte *)(lVar1 + 0x300) & 1) != 0)) {
    *(undefined8 *)(lVar1 + 0x358) = *(undefined8 *)(event + 0x28);
    QVar4 = mapToScene(this,(QPoint *)(lVar1 + 0x358));
    *(qreal *)(lVar1 + 0x348) = QVar4.xp;
    *(qreal *)(lVar1 + 0x350) = QVar4.yp;
    uVar2 = *(undefined8 *)(event + 0x30);
    *(undefined8 *)(lVar1 + 0x360) = uVar2;
    *(undefined8 *)(lVar1 + 0x368) = *(undefined8 *)(lVar1 + 0x348);
    *(undefined8 *)(lVar1 + 0x370) = *(undefined8 *)(lVar1 + 0x350);
    *(undefined8 *)(lVar1 + 0x388) = uVar2;
    local_48.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneContextMenuEvent::QGraphicsSceneContextMenuEvent
              ((QGraphicsSceneContextMenuEvent *)local_58,GraphicsSceneContextMenu);
    widget = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)local_58,widget);
    QGraphicsSceneContextMenuEvent::setScenePos
              ((QGraphicsSceneContextMenuEvent *)local_58,(QPointF *)(lVar1 + 0x348));
    QGraphicsSceneContextMenuEvent::setScreenPos
              ((QGraphicsSceneContextMenuEvent *)local_58,(QPoint *)(lVar1 + 0x360));
    QGraphicsSceneContextMenuEvent::setModifiers
              ((QGraphicsSceneContextMenuEvent *)local_58,
               (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
               *(QFlagsStorage<Qt::KeyboardModifier> *)(event + 0x20));
    QGraphicsSceneContextMenuEvent::setReason
              ((QGraphicsSceneContextMenuEvent *)local_58,(uint)(byte)event[0x38]);
    QStack_4c = event[0xc];
    QGraphicsSceneEvent::setTimestamp((QGraphicsSceneEvent *)local_58,*(quint64 *)(event + 0x18));
    if ((*(long *)(lVar1 + 0x490) == 0) || (*(int *)(*(long *)(lVar1 + 0x490) + 4) == 0)) {
      pQVar3 = (QObject *)0x0;
    }
    else {
      pQVar3 = *(QObject **)(lVar1 + 0x498);
    }
    QCoreApplication::sendEvent(pQVar3,(QEvent *)local_58);
    (**(code **)(*(long *)event + 0x10))(event,QStack_4c);
    QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::contextMenuEvent(QContextMenuEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed)
        return;

    d->mousePressViewPoint = event->pos();
    d->mousePressScenePoint = mapToScene(d->mousePressViewPoint);
    d->mousePressScreenPoint = event->globalPos();
    d->lastMouseMoveScenePoint = d->mousePressScenePoint;
    d->lastMouseMoveScreenPoint = d->mousePressScreenPoint;

    QGraphicsSceneContextMenuEvent contextEvent(QEvent::GraphicsSceneContextMenu);
    contextEvent.setWidget(viewport());
    contextEvent.setScenePos(d->mousePressScenePoint);
    contextEvent.setScreenPos(d->mousePressScreenPoint);
    contextEvent.setModifiers(event->modifiers());
    contextEvent.setReason((QGraphicsSceneContextMenuEvent::Reason)(event->reason()));
    contextEvent.setAccepted(event->isAccepted());
    contextEvent.setTimestamp(event->timestamp());
    QCoreApplication::sendEvent(d->scene, &contextEvent);
    event->setAccepted(contextEvent.isAccepted());
}